

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlXPathObjectPtr xmlXPathObjectCopy(xmlXPathObjectPtr val)

{
  xmlGenericErrorFunc p_Var1;
  double dVar2;
  void *pvVar3;
  void *pvVar4;
  undefined4 uVar5;
  int iVar6;
  undefined4 uVar7;
  xmlXPathObjectType xVar8;
  undefined4 uVar9;
  xmlChar *pxVar10;
  xmlNodeSetPtr pxVar11;
  xmlLocationSetPtr pxVar12;
  xmlGenericErrorFunc *pp_Var13;
  void **ppvVar14;
  xmlLocationSetPtr loc;
  xmlXPathObjectPtr ret;
  xmlXPathObjectPtr val_local;
  
  if (val == (xmlXPathObjectPtr)0x0) {
    val_local = (xmlXPathObjectPtr)0x0;
  }
  else {
    val_local = (xmlXPathObjectPtr)(*xmlMalloc)(0x48);
    if (val_local == (xmlXPathObjectPtr)0x0) {
      xmlXPathErrMemory((xmlXPathContextPtr)0x0,"copying object\n");
      val_local = (xmlXPathObjectPtr)0x0;
    }
    else {
      uVar5 = *(undefined4 *)&val->field_0x44;
      val_local->index2 = val->index2;
      *(undefined4 *)&val_local->field_0x44 = uVar5;
      xVar8 = val->type;
      uVar9 = *(undefined4 *)&val->field_0x4;
      pxVar11 = val->nodesetval;
      iVar6 = val->boolval;
      uVar7 = *(undefined4 *)&val->field_0x14;
      dVar2 = val->floatval;
      pxVar10 = val->stringval;
      pvVar3 = val->user;
      uVar5 = *(undefined4 *)&val->field_0x34;
      pvVar4 = val->user2;
      val_local->index = val->index;
      *(undefined4 *)&val_local->field_0x34 = uVar5;
      val_local->user2 = pvVar4;
      val_local->stringval = pxVar10;
      val_local->user = pvVar3;
      val_local->boolval = iVar6;
      *(undefined4 *)&val_local->field_0x14 = uVar7;
      val_local->floatval = dVar2;
      val_local->type = xVar8;
      *(undefined4 *)&val_local->field_0x4 = uVar9;
      val_local->nodesetval = pxVar11;
      switch(val->type) {
      case XPATH_UNDEFINED:
        pp_Var13 = __xmlGenericError();
        p_Var1 = *pp_Var13;
        ppvVar14 = __xmlGenericErrorContext();
        (*p_Var1)(*ppvVar14,"xmlXPathObjectCopy: unsupported type %d\n",(ulong)val->type);
        break;
      case XPATH_NODESET:
      case XPATH_XSLT_TREE:
        pxVar11 = xmlXPathNodeSetMerge((xmlNodeSetPtr)0x0,val->nodesetval);
        val_local->nodesetval = pxVar11;
        val_local->boolval = 0;
        break;
      case XPATH_BOOLEAN:
      case XPATH_NUMBER:
      case XPATH_POINT:
      case XPATH_RANGE:
        break;
      case XPATH_STRING:
        pxVar10 = xmlStrdup(val->stringval);
        val_local->stringval = pxVar10;
        break;
      case XPATH_LOCATIONSET:
        pxVar12 = xmlXPtrLocationSetMerge((xmlLocationSetPtr)0x0,(xmlLocationSetPtr)val->user);
        val_local->user = pxVar12;
        break;
      case XPATH_USERS:
        val_local->user = val->user;
      }
    }
  }
  return val_local;
}

Assistant:

xmlXPathObjectPtr
xmlXPathObjectCopy(xmlXPathObjectPtr val) {
    xmlXPathObjectPtr ret;

    if (val == NULL)
	return(NULL);

    ret = (xmlXPathObjectPtr) xmlMalloc(sizeof(xmlXPathObject));
    if (ret == NULL) {
        xmlXPathErrMemory(NULL, "copying object\n");
	return(NULL);
    }
    memcpy(ret, val , (size_t) sizeof(xmlXPathObject));
#ifdef XP_DEBUG_OBJ_USAGE
    xmlXPathDebugObjUsageRequested(NULL, val->type);
#endif
    switch (val->type) {
	case XPATH_BOOLEAN:
	case XPATH_NUMBER:
	case XPATH_POINT:
	case XPATH_RANGE:
	    break;
	case XPATH_STRING:
	    ret->stringval = xmlStrdup(val->stringval);
	    break;
	case XPATH_XSLT_TREE:
#if 0
/*
  Removed 11 July 2004 - the current handling of xslt tmpRVT nodes means that
  this previous handling is no longer correct, and can cause some serious
  problems (ref. bug 145547)
*/
	    if ((val->nodesetval != NULL) &&
		(val->nodesetval->nodeTab != NULL)) {
		xmlNodePtr cur, tmp;
		xmlDocPtr top;

		ret->boolval = 1;
		top =  xmlNewDoc(NULL);
		top->name = (char *)
		    xmlStrdup(val->nodesetval->nodeTab[0]->name);
		ret->user = top;
		if (top != NULL) {
		    top->doc = top;
		    cur = val->nodesetval->nodeTab[0]->children;
		    while (cur != NULL) {
			tmp = xmlDocCopyNode(cur, top, 1);
			xmlAddChild((xmlNodePtr) top, tmp);
			cur = cur->next;
		    }
		}

		ret->nodesetval = xmlXPathNodeSetCreate((xmlNodePtr) top);
	    } else
		ret->nodesetval = xmlXPathNodeSetCreate(NULL);
	    /* Deallocate the copied tree value */
	    break;
#endif
	case XPATH_NODESET:
            /* TODO: Check memory error. */
	    ret->nodesetval = xmlXPathNodeSetMerge(NULL, val->nodesetval);
	    /* Do not deallocate the copied tree value */
	    ret->boolval = 0;
	    break;
	case XPATH_LOCATIONSET:
#ifdef LIBXML_XPTR_ENABLED
	{
	    xmlLocationSetPtr loc = val->user;
	    ret->user = (void *) xmlXPtrLocationSetMerge(NULL, loc);
	    break;
	}
#endif
        case XPATH_USERS:
	    ret->user = val->user;
	    break;
        case XPATH_UNDEFINED:
	    xmlGenericError(xmlGenericErrorContext,
		    "xmlXPathObjectCopy: unsupported type %d\n",
		    val->type);
	    break;
    }
    return(ret);
}